

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS
ref_search_trim(REF_SEARCH ref_search,REF_INT parent,REF_DBL *position,REF_DBL *trim_radius)

{
  uint uVar1;
  double dVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL distance;
  REF_INT i;
  REF_DBL *trim_radius_local;
  REF_DBL *position_local;
  REF_INT parent_local;
  REF_SEARCH ref_search_local;
  
  if (((parent != -1) && (parent < ref_search->n)) && (ref_search->item[parent] != -1)) {
    _ref_private_macro_code_rss_1 = 0.0;
    for (distance._4_4_ = 0; distance._4_4_ < ref_search->d; distance._4_4_ = distance._4_4_ + 1) {
      dVar2 = pow(position[distance._4_4_] -
                  ref_search->pos[distance._4_4_ + ref_search->d * parent],2.0);
      _ref_private_macro_code_rss_1 = dVar2 + _ref_private_macro_code_rss_1;
    }
    dVar2 = sqrt(_ref_private_macro_code_rss_1);
    if (dVar2 + ref_search->radius[parent] < *trim_radius) {
      *trim_radius = dVar2 + ref_search->radius[parent];
    }
    if (dVar2 - ref_search->children_ball[parent] < *trim_radius) {
      uVar1 = ref_search_trim(ref_search,ref_search->left[parent],position,trim_radius);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               0x158,"ref_search_trim",(ulong)uVar1,"gthr");
        return uVar1;
      }
      uVar1 = ref_search_trim(ref_search,ref_search->right[parent],position,trim_radius);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               0x15b,"ref_search_trim",(ulong)uVar1,"gthr");
        return uVar1;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_search_trim(REF_SEARCH ref_search, REF_INT parent,
                                          REF_DBL *position,
                                          REF_DBL *trim_radius) {
  REF_INT i;
  REF_DBL distance;

  if (REF_EMPTY == parent) return REF_SUCCESS;
  if (parent >= ref_search->n) return REF_SUCCESS;
  if (REF_EMPTY == ref_search->item[parent]) return REF_SUCCESS;

  distance = 0.0;
  for (i = 0; i < ref_search->d; i++)
    distance +=
        pow(position[i] - ref_search->pos[i + ref_search->d * parent], 2);
  distance = sqrt(distance);

  if (distance + ref_search->radius[parent] < *trim_radius) {
    *trim_radius = distance + ref_search->radius[parent];
  }

  /* if the trim_distance is larger than the distance between me and the target
   * minus the children_ball look for better */
  if (*trim_radius > distance - ref_search->children_ball[parent]) {
    RSS(ref_search_trim(ref_search, ref_search->left[parent], position,
                        trim_radius),
        "gthr");
    RSS(ref_search_trim(ref_search, ref_search->right[parent], position,
                        trim_radius),
        "gthr");
  }

  return REF_SUCCESS;
}